

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall
ON_PolyEdgeCurve::Insert(ON_PolyEdgeCurve *this,int segment_index,ON_PolyEdgeSegment *new_segment)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  undefined1 local_40 [8];
  ON_Interval d;
  ON_PolyEdgeSegment *seg;
  int i;
  bool rc;
  ON_PolyEdgeSegment *new_segment_local;
  int segment_index_local;
  ON_PolyEdgeCurve *this_local;
  
  (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x17])(this,1);
  seg._7_1_ = false;
  if (segment_index < 1) {
    if (segment_index == 0) {
      seg._7_1_ = Prepend(this,new_segment);
    }
  }
  else {
    seg._7_1_ = ON_PolyCurve::Insert
                          (&this->super_ON_PolyCurve,segment_index,(ON_Curve *)new_segment);
    seg._0_4_ = segment_index;
    if (seg._7_1_) {
      for (; iVar3 = ON_PolyCurve::Count(&this->super_ON_PolyCurve), (int)seg < iVar3;
          seg._0_4_ = (int)seg + 1) {
        d.m_t[1] = (double)SegmentCurve(this,(int)seg);
        _local_40 = ON_PolyCurve::SegmentDomain(&this->super_ON_PolyCurve,(int)seg);
        dVar2 = d.m_t[1];
        pdVar4 = ON_Interval::operator[]((ON_Interval *)local_40,0);
        dVar1 = *pdVar4;
        pdVar4 = ON_Interval::operator[]((ON_Interval *)local_40,1);
        (**(code **)(*(long *)dVar2 + 0x130))(dVar1,*pdVar4);
      }
    }
  }
  return seg._7_1_;
}

Assistant:

bool ON_PolyEdgeCurve::Insert( 
         int segment_index,
         ON_PolyEdgeSegment* new_segment
         )
{
  DestroyRuntimeCache();
  bool rc = false;
  if ( segment_index > 0 )
  {
    //m_is_closed_helper = 0;
    rc = ON_PolyCurve::Insert(segment_index,new_segment);
    if ( rc )
    {
      int i;
      for ( i = segment_index; i < Count(); i++ )
      {
        ON_PolyEdgeSegment* seg = SegmentCurve(i);
        ON_Interval d = SegmentDomain(i);
        seg->SetDomain(d[0],d[1]);
      }
    }
  }
  else if ( segment_index == 0 )
    rc = Prepend(new_segment);
  return rc;
}